

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_conncache_close_all_connections(conncache *connc)

{
  Curl_easy **datap;
  Curl_easy *data;
  connectdata *conn;
  sigpipe_ignore pipe_st;
  
  conn = conncache_find_first_connection(connc);
  datap = &connc->closure_handle;
  while (conn != (connectdata *)0x0) {
    data = connc->closure_handle;
    conn->data = data;
    sigpipe_ignore(data,&pipe_st);
    Curl_conncontrol(conn,1);
    Curl_disconnect(connc->closure_handle,conn,false);
    sigpipe_restore(&pipe_st);
    conn = conncache_find_first_connection(connc);
  }
  if (*datap != (Curl_easy *)0x0) {
    sigpipe_ignore(*datap,&pipe_st);
    Curl_hostcache_clean(*datap,((*datap)->dns).hostcache);
    Curl_close(datap);
    sigpipe_restore(&pipe_st);
  }
  return;
}

Assistant:

void Curl_conncache_close_all_connections(struct conncache *connc)
{
  struct connectdata *conn;

  conn = conncache_find_first_connection(connc);
  while(conn) {
    SIGPIPE_VARIABLE(pipe_st);
    conn->data = connc->closure_handle;

    sigpipe_ignore(conn->data, &pipe_st);
    /* This will remove the connection from the cache */
    connclose(conn, "kill all");
    (void)Curl_disconnect(connc->closure_handle, conn, FALSE);
    sigpipe_restore(&pipe_st);

    conn = conncache_find_first_connection(connc);
  }

  if(connc->closure_handle) {
    SIGPIPE_VARIABLE(pipe_st);
    sigpipe_ignore(connc->closure_handle, &pipe_st);

    Curl_hostcache_clean(connc->closure_handle,
                         connc->closure_handle->dns.hostcache);
    Curl_close(&connc->closure_handle);
    sigpipe_restore(&pipe_st);
  }
}